

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void * operator_new__(size_t size,nothrow_t *param_2)

{
  int iVar1;
  ThreadCache *this;
  bool bVar2;
  int32_t iVar3;
  nothrow_t *param_1_local;
  size_t size_local;
  size_t allocated_size;
  ThreadCache *pTStack_c8;
  uint32_t cl;
  ThreadCache *cache;
  void *local_b8;
  uint local_ac;
  long lStack_a8;
  uint32_t idx;
  ThreadCache *local_a0;
  SizeMap *local_98;
  undefined1 local_8d;
  uint local_8c;
  SizeMap *local_88;
  uint *local_80;
  ThreadCache *local_78;
  char local_69;
  void *local_60;
  void *rv;
  FreeList *list;
  uint local_44;
  size_t local_40;
  ThreadCache *local_38;
  void *local_30;
  ThreadCache *local_28;
  ThreadCache *local_20;
  ThreadCache *local_18;
  ThreadCache *local_10;
  
  cache = (ThreadCache *)size;
  bVar2 = base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::empty
                    ((HookList<void_(*)(const_void_*,_unsigned_long)> *)base::internal::new_hooks_);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pTStack_c8 = tcmalloc::ThreadCachePtr::GetIfPresent();
    if (pTStack_c8 == (ThreadCache *)0x0) {
      local_20 = cache;
      local_b8 = tcmalloc::allocate_full_cpp_nothrow_oom((size_t)cache);
    }
    else {
      local_98 = tcmalloc::Static::sizemap();
      local_a0 = cache;
      lStack_a8 = (long)&allocated_size + 4;
      local_78 = cache;
      local_80 = &local_ac;
      if (cache < (ThreadCache *)0x401) {
        local_ac = (int)cache + 7U >> 3;
        local_69 = '\x01';
      }
      else if (cache < (ThreadCache *)0x40001) {
        local_ac = (int)cache + 0x3c7fU >> 7;
        local_69 = '\x01';
      }
      else {
        local_69 = '\0';
      }
      local_8d = local_69 != '\0';
      if ((bool)local_8d) {
        allocated_size._4_4_ = (uint)local_98->class_array_[local_ac];
        local_88 = tcmalloc::Static::sizemap();
        local_8c = allocated_size._4_4_;
        iVar1 = local_88->class_to_size_[allocated_size._4_4_];
        bVar2 = tcmalloc::ThreadCache::TryRecordAllocationFast(pTStack_c8,(long)iVar1);
        this = pTStack_c8;
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          local_38 = pTStack_c8;
          local_44 = allocated_size._4_4_;
          list = (FreeList *)tcmalloc::cpp_nothrow_oom;
          rv = pTStack_c8->list_ + allocated_size._4_4_;
          local_40 = (long)iVar1;
          iVar3 = tcmalloc::ThreadCache::FreeList::object_size((FreeList *)rv);
          local_40 = (size_t)iVar3;
          bVar2 = tcmalloc::ThreadCache::FreeList::TryPop((FreeList *)rv,&local_60);
          if (bVar2) {
            this->size_ = this->size_ - (int32_t)local_40;
            local_30 = local_60;
          }
          else {
            local_30 = tcmalloc::ThreadCache::FetchFromCentralCache
                                 (this,local_44,(int32_t)local_40,(_func_void_ptr_size_t *)list);
          }
          local_b8 = local_30;
        }
        else {
          local_10 = cache;
          local_b8 = tcmalloc::allocate_full_cpp_nothrow_oom((size_t)cache);
        }
      }
      else {
        local_18 = cache;
        local_b8 = tcmalloc::allocate_full_cpp_nothrow_oom((size_t)cache);
      }
    }
  }
  else {
    local_28 = cache;
    local_b8 = tcmalloc::allocate_full_cpp_nothrow_oom((size_t)cache);
  }
  return local_b8;
}

Assistant:

PERFTOOLS_DLL_DECL CACHELINE_ALIGNED_FN
void* tc_new_nothrow(size_t size, const std::nothrow_t&) PERFTOOLS_NOTHROW {
  return malloc_fast_path<tcmalloc::cpp_nothrow_oom>(size);
}